

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamReaderPrivate::Open(BamReaderPrivate *this,string *filename)

{
  int64_t iVar1;
  string message;
  string error;
  
  Close(this);
  BgzfStream::Open(&this->m_stream,filename,ReadOnly);
  LoadHeaderData(this);
  LoadReferenceData(this);
  std::__cxx11::string::_M_assign((string *)&this->m_filename);
  iVar1 = BgzfStream::Tell(&this->m_stream);
  this->m_alignmentsBeginOffset = iVar1;
  return true;
}

Assistant:

bool BamReaderPrivate::Open(const string& filename) {

    try {

        // make sure we're starting with fresh state
        Close();

        // open BgzfStream
        m_stream.Open(filename, IBamIODevice::ReadOnly);

        // load BAM metadata
        LoadHeaderData();
        LoadReferenceData();

        // store filename & offset of first alignment
        m_filename = filename;
        m_alignmentsBeginOffset = m_stream.Tell();

        // return success
        return true;

    } catch ( BamException& e ) {
        const string error = e.what();
        const string message = string("could not open file: ") + filename +
                               "\n\t" + error;
        SetErrorString("BamReader::Open", message);
        return false;
    }
}